

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Operator_Matches::is_match(Operator_Matches *this,size_t t_group,string_view t_str)

{
  bool bVar1;
  long lVar2;
  anon_class_8_1_a8a98306 match;
  string_view t_str_local;
  
  t_str_local._M_str = t_str._M_str;
  t_str_local._M_len = t_str._M_len;
  match.t_str = &t_str_local;
  switch(t_group) {
  case 0:
    break;
  case 1:
    this = (Operator_Matches *)&this->m_1;
    break;
  case 2:
    this = (Operator_Matches *)&this->m_2;
    break;
  case 3:
    this = (Operator_Matches *)&this->m_3;
    break;
  case 4:
    this = (Operator_Matches *)&this->m_4;
    break;
  case 5:
    this = (Operator_Matches *)&this->m_5;
    break;
  case 6:
    lVar2 = 0x60;
    goto LAB_0053b784;
  case 7:
    bVar1 = const::{lambda(auto:1_const&)#1}::operator()
                      ((_lambda_auto_1_const___1_ *)&match,&this->m_7);
    return bVar1;
  case 8:
    lVar2 = 0xc0;
    goto LAB_0053b784;
  case 9:
    lVar2 = 0xe0;
LAB_0053b784:
    bVar1 = const::{lambda(auto:1_const&)#1}::operator()
                      ((_lambda_auto_1_const___1_ *)&match,
                       (array<chaiscript::utility::Static_String,_2UL> *)
                       ((long)&(this->m_0)._M_elems[0].m_size + lVar2));
    return bVar1;
  case 10:
    bVar1 = const::{lambda(auto:1_const&)#1}::operator()
                      ((_lambda_auto_1_const___1_ *)&match,&this->m_10);
    return bVar1;
  case 0xb:
    bVar1 = const::{lambda(auto:1_const&)#1}::operator()
                      ((_lambda_auto_1_const___1_ *)&match,&this->m_11);
    return bVar1;
  default:
    return false;
  }
  bVar1 = const::{lambda(auto:1_const&)#1}::operator()
                    ((_lambda_auto_1_const___1_ *)&match,&this->m_0);
  return bVar1;
}

Assistant:

constexpr bool is_match(const std::size_t t_group, std::string_view t_str) const noexcept {
          auto match = [&t_str](const auto &array) {
            return std::any_of(array.begin(), array.end(), [&t_str](const auto &v) { return v == t_str; });
          };

          switch (t_group) {
            case 0:
              return match(m_0);
            case 1:
              return match(m_1);
            case 2:
              return match(m_2);
            case 3:
              return match(m_3);
            case 4:
              return match(m_4);
            case 5:
              return match(m_5);
            case 6:
              return match(m_6);
            case 7:
              return match(m_7);
            case 8:
              return match(m_8);
            case 9:
              return match(m_9);
            case 10:
              return match(m_10);
            case 11:
              return match(m_11);
            default:
              return false;
          }
        }